

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_footer_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string footer;
  
  App::get_footer_abi_cxx11_(&footer,app);
  if (footer._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::operator+(&local_50,'\n',&footer);
    ::std::operator+(__return_storage_ptr__,&local_50,"\n\n");
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::~string((string *)&footer);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_footer(const App *app) const {
    std::string footer = app->get_footer();
    if(footer.empty()) {
        return std::string{};
    }
    return '\n' + footer + "\n\n";
}